

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builderutil_snap_functions.cc
# Opt level: O0

void __thiscall
s2builderutil::IntLatLngSnapFunction::set_exponent(IntLatLngSnapFunction *this,int exponent)

{
  ostream *poVar1;
  S1Angle snap_radius;
  int local_6c;
  double dStack_68;
  int i;
  double power;
  S2LogMessage local_50;
  S2LogMessageVoidify local_3d [20];
  byte local_29;
  S2LogMessage local_28;
  S2LogMessageVoidify local_15;
  int local_14;
  IntLatLngSnapFunction *pIStack_10;
  int exponent_local;
  IntLatLngSnapFunction *this_local;
  
  local_29 = 0;
  local_14 = exponent;
  pIStack_10 = this;
  if (exponent < 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builderutil_snap_functions.cc"
               ,0xda,kFatal,(ostream *)&std::cerr);
    local_29 = 1;
    poVar1 = S2LogMessage::stream(&local_28);
    poVar1 = std::operator<<(poVar1,"Check failed: (exponent) >= (kMinExponent) ");
    S2LogMessageVoidify::operator&(&local_15,poVar1);
  }
  if ((local_29 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_28);
  }
  if (10 < local_14) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builderutil_snap_functions.cc"
               ,0xdb,kFatal,(ostream *)&std::cerr);
    poVar1 = S2LogMessage::stream(&local_50);
    poVar1 = std::operator<<(poVar1,"Check failed: (exponent) <= (kMaxExponent) ");
    S2LogMessageVoidify::operator&(local_3d,poVar1);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_50);
  }
  this->exponent_ = local_14;
  snap_radius = MinSnapRadiusForExponent(local_14);
  set_snap_radius(this,snap_radius);
  dStack_68 = 1.0;
  for (local_6c = 0; local_6c < local_14; local_6c = local_6c + 1) {
    dStack_68 = dStack_68 * 10.0;
  }
  this->from_degrees_ = dStack_68;
  this->to_degrees_ = 1.0 / dStack_68;
  return;
}

Assistant:

void IntLatLngSnapFunction::set_exponent(int exponent) {
  S2_DCHECK_GE(exponent, kMinExponent);
  S2_DCHECK_LE(exponent, kMaxExponent);
  exponent_ = exponent;
  set_snap_radius(MinSnapRadiusForExponent(exponent));

  // Precompute the scale factors needed for snapping.  Note that these
  // calculations need to exactly match the ones in s1angle.h to ensure
  // that the same S2Points are generated.
  double power = 1;
  for (int i = 0; i < exponent; ++i) power *= 10;
  from_degrees_ = power;
  to_degrees_ = 1 / power;
}